

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_parse_negative_int<int>(string *text,int *value_p)

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  int *in_RSI;
  int digit;
  uchar c;
  char *end;
  char *start;
  int vmin_over_base;
  int vmin;
  int value;
  int base;
  byte *local_30;
  int local_20;
  
  local_20 = 0;
  local_30 = (byte *)std::__cxx11::string::data();
  lVar2 = std::__cxx11::string::size();
  pbVar3 = local_30 + lVar2;
  while( true ) {
    if (pbVar3 <= local_30) {
      *in_RSI = local_20;
      return true;
    }
    iVar1 = *local_30 - 0x30;
    if ((9 < iVar1) || (iVar1 < 0)) {
      *in_RSI = local_20;
      return false;
    }
    if (local_20 < -0xccccccc) {
      *in_RSI = -0x80000000;
      return false;
    }
    if (local_20 * 10 < (int)(*local_30 + 0x7fffffd0)) break;
    local_20 = local_20 * 10 - iVar1;
    local_30 = local_30 + 1;
  }
  *in_RSI = -0x80000000;
  return false;
}

Assistant:

bool safe_parse_negative_int(const std::string &text, IntType *value_p) {
  int base = 10;
  IntType value = 0;
  const IntType vmin = std::numeric_limits<IntType>::min();
  assert(vmin < 0);
  assert(vmin <= 0 - base);
  IntType vmin_over_base = vmin / base;
  // 2003 c++ standard [expr.mul]
  // "... the sign of the remainder is implementation-defined."
  // Although (vmin/base)*base + vmin%base is always vmin.
  // 2011 c++ standard tightens the spec but we cannot rely on it.
  if (vmin % base > 0) {
    vmin_over_base += 1;
  }
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    int digit = c - '0';
    if (digit >= base || digit < 0) {
      *value_p = value;
      return false;
    }
    if (value < vmin_over_base) {
      *value_p = vmin;
      return false;
    }
    value *= base;
    if (value < vmin + digit) {
      *value_p = vmin;
      return false;
    }
    value -= digit;
  }
  *value_p = value;
  return true;
}